

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double pgamma(double x,double a)

{
  double dVar1;
  double dVar2;
  double local_80;
  double fact;
  double delta;
  double g0;
  double g;
  double b1;
  double b0;
  double a1;
  double a0;
  double la;
  double s;
  double d;
  double ct;
  double oup;
  double a_local;
  double x_local;
  
  if (0.0 <= a) {
    oup = a;
    a_local = x;
    if (2e+20 < a) {
      dVar1 = sqrt(2e+20 / a);
      a_local = dVar1 * (x - (a - 0.3333333333333333)) + 2e+20;
      oup = 2e+20;
      if (a_local < 0.0) {
        a_local = 0.0;
      }
    }
    if ((((oup != 0.0) || (NAN(oup))) && ((a_local != 0.0 || (NAN(a_local))))) &&
       (a_local < oup + 1.0)) {
      d = oup;
      s = 1.0;
      la = 1.0;
      while( true ) {
        dVar1 = normf(s);
        dVar2 = eps(la);
        if (dVar1 < dVar2 * 100.0) break;
        d = d + 1.0;
        s = (a_local * s) / d;
        la = s + la;
      }
      dVar1 = log(a_local);
      dVar2 = gamma_log(oup + 1.0);
      dVar1 = exp((oup * dVar1 + -a_local) - dVar2);
      ct = la * dVar1;
      if ((0.0 < a_local) && (1.0 < ct)) {
        ct = 1.0;
      }
    }
    if (((oup != 0.0) || (NAN(oup))) && (oup + 1.0 <= a_local)) {
      a1 = 1.0;
      b0 = a_local;
      b1 = 0.0;
      g = 1.0;
      local_80 = 1.0 / a_local;
      d = 1.0;
      fact = normf(local_80 * 1.0 - 0.0);
      g0 = local_80 * 1.0;
      while( true ) {
        dVar1 = normf(g0);
        dVar1 = eps(dVar1);
        if (fact < dVar1 * 100.0) break;
        a1 = (a1 * (d - oup) + b0) * local_80;
        b1 = (b1 * (d - oup) + g) * local_80;
        b0 = a_local * a1 + d * local_80 * b0;
        g = a_local * b1 + d * local_80 * g;
        local_80 = 1.0 / b0;
        d = d + 1.0;
        fact = normf(g * local_80 - g0);
        g0 = g * local_80;
      }
      dVar1 = log(a_local);
      dVar2 = gamma_log(oup);
      dVar1 = exp((oup * dVar1 + -a_local) - dVar2);
      ct = -g0 * dVar1 + 1.0;
    }
    if ((a_local == 0.0) && (!NAN(a_local))) {
      ct = 0.0;
    }
    if ((oup == 0.0) && (!NAN(oup))) {
      ct = 1.0;
    }
    return ct;
  }
  printf("a must be non-negative");
  exit(1);
}

Assistant:

double pgamma(double x, double a) {
	double oup,ct,d,s,la;
	double a0,a1,b0,b1,g,g0,delta,fact;
	// Negative a
	if (a < 0.) {
		printf("a must be non-negative");
		exit(1);
	}
	
	// a -> inf
	la = 2.0e20;
	if (a > la) {
		x = la - 1.0/3.0 + sqrt(la/a)*(x - (a-1.0/3.0));
		a = la;
		if ( x < 0.0) {
			x = 0.0;
		}
	}
	
	// x < a + 1
	
	if ( a != 0 && x != 0 && x < a + 1) {
		ct = a;
		d = 1.;
		s = 1.;
		
		while (normf(d) >= 100*eps(s)) {
			ct += 1.0;
			d = x*d/ct;
			s += d;
		}
		oup = s * exp( -x + a * log(x) - gamma_log(a + 1));
		if ( x > 0 && oup > 1.) {
			oup = 1.0;
		}
	}
	
	if ( a != 0 && x >= a + 1) {
		a0 = 1.0;
		a1 = x;
		b0 = 0.0;
		b1 = 1.0;
		fact = 1.0/a1;
		ct = 1.0;
		g = b1 * fact;
		g0 = b0;
		delta = normf(g - g0);
		
		while (delta >= 100*eps(normf(g))) {
			g0 = g;
			d = ct - a;
			a0 = (a1 + a0*d)*fact;
			b0 = (b1 + b0*d)*fact;
			s = ct*fact;
			a1 = x * a0 + s * a1;
			b1 = x * b0 + s * b1;
			fact = 1.0/a1;
			ct += 1.0;
			g = b1 * fact;
			delta = normf(g - g0);
			
		}
		oup = 1.0 - g * exp( -x + a * log(x) - gamma_log(a));
		
	}
	
	if ( x == 0) {
		oup = 0.0;
	}
	
	if ( a == 0) {
		oup = 1.0;
	}
	
	
	return oup;
}